

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  cmCTest *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  mapped_type pcVar1;
  bool bVar2;
  __type _Var3;
  int __errnum;
  mapped_type *ppcVar4;
  pointer puVar5;
  pointer puVar6;
  reference __x;
  ostream *poVar7;
  char *pcVar8;
  mapped_type_conflict1 *pmVar9;
  size_t sVar10;
  pointer pcVar11;
  mapped_type *resources;
  reference key;
  mapped_type *pmVar12;
  reference __rhs;
  reference this_02;
  reference __lhs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
  *this_03;
  mapped_type *this_04;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> local_538;
  allocator<char> local_529;
  string local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> local_4a8;
  undefined1 local_4a0 [8];
  cmWorkingDirectory workdir;
  string local_470;
  string local_450;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> local_430;
  reference local_428;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>
  *res;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  mapped_type *__range4_1;
  cmCTestTestResourceRequirement *requirement;
  const_iterator __end5;
  const_iterator __begin5;
  vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
  *__range5;
  vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
  *group;
  iterator __end4;
  iterator __begin4;
  vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
  *__range4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>
  *it;
  iterator __end2;
  iterator __begin2;
  mapped_type *__range2;
  ostringstream e;
  string *f;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  __single_object testRun;
  ostringstream local_1e8 [8];
  ostringstream cmCTestLog_msg;
  _Rb_tree_const_iterator<unsigned_long> local_60;
  iterator p;
  size_t i;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> affinity;
  size_t needProcessors;
  cmCTestMultiProcessHandler *pcStack_18;
  int test_local;
  cmCTestMultiProcessHandler *this_local;
  
  needProcessors._4_4_ = test;
  pcStack_18 = this;
  if ((this->HaveAffinity != 0) &&
     (ppcVar4 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)((long)&needProcessors + 4)),
     ((*ppcVar4)->WantAffinity & 1U) != 0)) {
    puVar5 = (pointer)GetProcessorsUsed(this,needProcessors._4_4_);
    affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar5;
    puVar6 = (pointer)std::
                      set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                      size(&this->ProcessorsAvailable);
    if (puVar6 < puVar5) {
      this_local._7_1_ = 0;
      goto LAB_0023ea08;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
               (size_type)
               affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    for (p._M_node = (_Base_ptr)0x0;
        p._M_node <
        affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
        p._M_node = (_Base_ptr)((long)&(p._M_node)->_M_color + 1)) {
      local_60._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     (&this->ProcessorsAvailable);
      __x = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_60);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,__x);
      std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
      erase_abi_cxx11_((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)
                       &this->ProcessorsAvailable,(const_iterator)local_60._M_node);
    }
    ppcVar4 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,(key_type *)((long)&needProcessors + 4));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(*ppcVar4)->Affinity,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  }
  std::__cxx11::ostringstream::ostringstream(local_1e8);
  poVar7 = std::operator<<((ostream *)local_1e8,"test ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,needProcessors._4_4_);
  std::operator<<(poVar7,"\n");
  this_00 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0xa8,pcVar8,(bool)(this->Quiet & 1));
  std::__cxx11::string::~string((string *)&testRun);
  std::__cxx11::ostringstream::~ostringstream(local_1e8);
  pmVar9 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,(key_type *)((long)&needProcessors + 4));
  *pmVar9 = true;
  EraseTest(this,needProcessors._4_4_);
  sVar10 = GetProcessorsUsed(this,needProcessors._4_4_);
  this->RunningCount = sVar10 + this->RunningCount;
  std::make_unique<cmCTestRunTest,cmCTestMultiProcessHandler&>
            ((cmCTestMultiProcessHandler *)&__range1);
  if (this->RepeatMode != Never) {
    pcVar11 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                        ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)
                         &__range1);
    cmCTestRunTest::SetRepeatMode(pcVar11,this->RepeatMode);
    pcVar11 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                        ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)
                         &__range1);
    cmCTestRunTest::SetNumberOfRuns(pcVar11,this->RepeatCount);
  }
  pcVar11 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                      ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&__range1
                      );
  cmCTestRunTest::SetIndex(pcVar11,needProcessors._4_4_);
  pcVar11 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                      ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&__range1
                      );
  ppcVar4 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)((long)&needProcessors + 4));
  cmCTestRunTest::SetTestProperties(pcVar11,*ppcVar4);
  if ((this->TestHandler->UseResourceSpec & 1U) != 0) {
    pcVar11 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                        ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)
                         &__range1);
    cmCTestRunTest::SetUseAllocatedResources(pcVar11,true);
    pcVar11 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                        ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)
                         &__range1);
    resources = std::map<$a129e267$>::operator[]
                          (&this->AllocatedResources,(key_type *)((long)&needProcessors + 4));
    cmCTestRunTest::SetAllocatedResources(pcVar11,resources);
  }
  this_01 = this->Failed;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_01);
  f = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(this_01);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&f), bVar2) {
    key = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    ppcVar4 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,(key_type *)((long)&needProcessors + 4));
    bVar2 = ::cm::
            contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&(*ppcVar4)->RequireSuccessDepends,key);
    if (bVar2) {
      pcVar11 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                          ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)
                           &__range1);
      cmCTestRunTest::AddFailedDependency(pcVar11,key);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  LockResources(this,needProcessors._4_4_);
  pmVar12 = std::
            map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>_>_>_>
            ::operator[](&this->ResourceAllocationErrors,(key_type *)((long)&needProcessors + 4));
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>
          ::empty(pmVar12);
  if (bVar2) {
    ppcVar4 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,(key_type *)((long)&needProcessors + 4));
    cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_4a0,&(*ppcVar4)->Directory);
    bVar2 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_4a0);
    if (bVar2) {
      std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::unique_ptr
                (&local_4a8,
                 (unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&__range1);
      ppcVar4 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)((long)&needProcessors + 4));
      std::operator+(&local_508,"Failed to change working directory to ",&(*ppcVar4)->Directory);
      std::operator+(&local_4e8,&local_508," : ");
      __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_4a0);
      pcVar8 = strerror(__errnum);
      std::operator+(&local_4c8,&local_4e8,pcVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"Failed to change working directory",&local_529);
      cmCTestRunTest::StartFailure(&local_4a8,&local_4c8,&local_528);
      std::__cxx11::string::~string((string *)&local_528);
      std::allocator<char>::~allocator(&local_529);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr(&local_4a8)
      ;
      this_local._7_1_ = 0;
    }
    else {
      std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::unique_ptr
                (&local_538,
                 (unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&__range1);
      this_local._7_1_ = cmCTestRunTest::StartTest(&local_538,this->Completed,this->Total);
      std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr(&local_538)
      ;
    }
    workdir.ResultCode = 1;
    cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_4a0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
    poVar7 = std::operator<<((ostream *)&__range2,"Insufficient resources for test ");
    ppcVar4 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,(key_type *)((long)&needProcessors + 4));
    poVar7 = std::operator<<(poVar7,(string *)*ppcVar4);
    std::operator<<(poVar7,":\n\n");
    pmVar12 = std::
              map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>_>_>_>
              ::operator[](&this->ResourceAllocationErrors,(key_type *)((long)&needProcessors + 4));
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>
             ::begin(pmVar12);
    it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>
            ::end(pmVar12);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&it), bVar2) {
      __rhs = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>
              ::operator*(&__end2);
      if (__rhs->second == NoResourceType) {
        poVar7 = std::operator<<((ostream *)&__range2,"  Test requested resources of type \'");
        poVar7 = std::operator<<(poVar7,(string *)__rhs);
        std::operator<<(poVar7,"\' which does not exist\n");
      }
      else if (__rhs->second == InsufficientResources) {
        poVar7 = std::operator<<((ostream *)&__range2,"  Test requested resources of type \'");
        poVar7 = std::operator<<(poVar7,(string *)__rhs);
        std::operator<<(poVar7,"\' in the following amounts:\n");
        ppcVar4 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&(this->Properties).
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,(key_type *)((long)&needProcessors + 4));
        pcVar1 = *ppcVar4;
        __end4 = std::
                 vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                 ::begin(&pcVar1->ResourceGroups);
        group = (vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                 *)std::
                   vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                   ::end(&pcVar1->ResourceGroups);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_*,_std::vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>_>
                                           *)&group), bVar2) {
          this_02 = __gnu_cxx::
                    __normal_iterator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_*,_std::vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>_>
                    ::operator*(&__end4);
          __end5 = std::
                   vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                   ::begin(this_02);
          requirement = (cmCTestTestResourceRequirement *)
                        std::
                        vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                        ::end(this_02);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_cmCTestTestHandler::cmCTestTestResourceRequirement_*,_std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>
                                             *)&requirement), bVar2) {
            __lhs = __gnu_cxx::
                    __normal_iterator<const_cmCTestTestHandler::cmCTestTestResourceRequirement_*,_std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>
                    ::operator*(&__end5);
            _Var3 = std::operator==(&__lhs->ResourceType,&__rhs->first);
            if (_Var3) {
              poVar7 = std::operator<<((ostream *)&__range2,"    ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,__lhs->SlotsNeeded);
              pcVar8 = " slots\n";
              if (__lhs->SlotsNeeded == 1) {
                pcVar8 = " slot\n";
              }
              std::operator<<(poVar7,pcVar8);
            }
            __gnu_cxx::
            __normal_iterator<const_cmCTestTestHandler::cmCTestTestResourceRequirement_*,_std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>
            ::operator++(&__end5);
          }
          __gnu_cxx::
          __normal_iterator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_*,_std::vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>_>
          ::operator++(&__end4);
        }
        std::operator<<((ostream *)&__range2,"  but only the following units were available:\n");
        this_03 = cmCTestResourceAllocator::GetResources_abi_cxx11_(&this->ResourceAllocator);
        this_04 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
                  ::at(this_03,&__rhs->first);
        __end4_1 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>
                   ::begin(this_04);
        res = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>
                 ::end(this_04);
        while (bVar2 = std::operator!=(&__end4_1,(_Self *)&res), bVar2) {
          local_428 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>
                      ::operator*(&__end4_1);
          poVar7 = std::operator<<((ostream *)&__range2,"    \'");
          poVar7 = std::operator<<(poVar7,(string *)local_428);
          poVar7 = std::operator<<(poVar7,"\': ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(local_428->second).Total);
          pcVar8 = " slots\n";
          if ((local_428->second).Total == 1) {
            pcVar8 = " slot\n";
          }
          std::operator<<(poVar7,pcVar8);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>
          ::operator++(&__end4_1);
        }
      }
      std::operator<<((ostream *)&__range2,"\n");
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>
      ::operator++(&__end2);
    }
    poVar7 = std::operator<<((ostream *)&__range2,"Resource spec file:\n\n  ");
    std::operator<<(poVar7,(string *)&this->TestHandler->ResourceSpecFile);
    std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::unique_ptr
              (&local_430,
               (unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&__range1);
    std::__cxx11::ostringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"Insufficient resources",(allocator<char> *)&workdir.field_0x27)
    ;
    cmCTestRunTest::StartFailure(&local_430,&local_450,&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator((allocator<char> *)&workdir.field_0x27);
    std::__cxx11::string::~string((string *)&local_450);
    std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr(&local_430);
    this_local._7_1_ = 0;
    workdir.ResultCode = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
  }
  std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr
            ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&__range1);
LAB_0023ea08:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  if (this->HaveAffinity && this->Properties[test]->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(test);
    if (needProcessors > this->ProcessorsAvailable.size()) {
      return false;
    }
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    this->Properties[test]->Affinity = std::move(affinity);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += this->GetProcessorsUsed(test);

  auto testRun = cm::make_unique<cmCTestRunTest>(*this);

  if (this->RepeatMode != cmCTest::Repeat::Never) {
    testRun->SetRepeatMode(this->RepeatMode);
    testRun->SetNumberOfRuns(this->RepeatCount);
  }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);
  if (this->TestHandler->UseResourceSpec) {
    testRun->SetUseAllocatedResources(true);
    testRun->SetAllocatedResources(this->AllocatedResources[test]);
  }

  // Find any failed dependencies for this test. We assume the more common
  // scenario has no failed tests, so make it the outer loop.
  for (std::string const& f : *this->Failed) {
    if (cm::contains(this->Properties[test]->RequireSuccessDepends, f)) {
      testRun->AddFailedDependency(f);
    }
  }

  // Always lock the resources we'll be using, even if we fail to set the
  // working directory because FinishTestProcess() will try to unlock them
  this->LockResources(test);

  if (!this->ResourceAllocationErrors[test].empty()) {
    std::ostringstream e;
    e << "Insufficient resources for test " << this->Properties[test]->Name
      << ":\n\n";
    for (auto const& it : this->ResourceAllocationErrors[test]) {
      switch (it.second) {
        case ResourceAllocationError::NoResourceType:
          e << "  Test requested resources of type '" << it.first
            << "' which does not exist\n";
          break;

        case ResourceAllocationError::InsufficientResources:
          e << "  Test requested resources of type '" << it.first
            << "' in the following amounts:\n";
          for (auto const& group : this->Properties[test]->ResourceGroups) {
            for (auto const& requirement : group) {
              if (requirement.ResourceType == it.first) {
                e << "    " << requirement.SlotsNeeded
                  << (requirement.SlotsNeeded == 1 ? " slot\n" : " slots\n");
              }
            }
          }
          e << "  but only the following units were available:\n";
          for (auto const& res :
               this->ResourceAllocator.GetResources().at(it.first)) {
            e << "    '" << res.first << "': " << res.second.Total
              << (res.second.Total == 1 ? " slot\n" : " slots\n");
          }
          break;
      }
      e << "\n";
    }
    e << "Resource spec file:\n\n  " << this->TestHandler->ResourceSpecFile;
    cmCTestRunTest::StartFailure(std::move(testRun), e.str(),
                                 "Insufficient resources");
    return false;
  }

  cmWorkingDirectory workdir(this->Properties[test]->Directory);
  if (workdir.Failed()) {
    cmCTestRunTest::StartFailure(std::move(testRun),
                                 "Failed to change working directory to " +
                                   this->Properties[test]->Directory + " : " +
                                   std::strerror(workdir.GetLastResult()),
                                 "Failed to change working directory");
    return false;
  }

  // Ownership of 'testRun' has moved to another structure.
  // When the test finishes, FinishTestProcess will be called.
  return cmCTestRunTest::StartTest(std::move(testRun), this->Completed,
                                   this->Total);
}